

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

HFParsingInfo * __thiscall
MlmWrap::createDigitalParsingInfo
          (MlmWrap *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels,string *dataformat)

{
  ulong uVar1;
  undefined1 uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  reference pbVar8;
  ostream *poVar9;
  string *in_RCX;
  MlmWrap *in_RDX;
  HFParsingInfo *in_RDI;
  NDeviceChannel channel;
  string ch;
  string dv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *channelstr;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t i;
  HFParsingInfo info;
  vector<int,_std::allocator<int>_> startlengths;
  NDeviceChannel *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  string *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  int in_stack_fffffffffffffc70;
  ostream *in_stack_fffffffffffffc78;
  ostream *in_stack_fffffffffffffc80;
  MlmWrap *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffcd8;
  allocator *paVar10;
  undefined6 in_stack_fffffffffffffce0;
  HFParsingInfo *this_00;
  string local_2f0 [32];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [144];
  string *in_stack_fffffffffffffe48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  MlmWrap *in_stack_fffffffffffffe58;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  reference local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110 [2];
  ulong local_100;
  undefined4 local_f4;
  string local_f0;
  undefined4 local_b8;
  int local_b0;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  vector<int,_std::allocator<int>_> local_38 [2];
  
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x36c3c7);
  std::__cxx11::string::string(local_58,in_RCX);
  uVar2 = verifyTrodesDataFormat
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  bVar3 = uVar2 ^ 0xff;
  std::__cxx11::string::~string(local_58);
  if ((bVar3 & 1) == 0) {
    HFParsingInfo::HFParsingInfo
              ((HFParsingInfo *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    local_f4 = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (value_type_conflict *)in_stack_fffffffffffffc48);
    local_100 = 0;
    while( true ) {
      uVar1 = local_100;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(local_38);
      if (sVar6 <= uVar1) break;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_38,local_100 + 1);
      iVar5 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      *pvVar7 = iVar5 + *pvVar7;
      local_100 = local_100 + 2;
    }
    local_110[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc48);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc48);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffc48);
      if (!bVar4) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(local_110);
      local_120 = pbVar8;
      std::__cxx11::string::find((char *)pbVar8,0x542754);
      std::__cxx11::string::substr((ulong)local_160,(ulong)pbVar8);
      CZHelp::trim_copy(in_stack_fffffffffffffc58);
      std::__cxx11::string::~string(local_160);
      pbVar8 = local_120;
      std::__cxx11::string::find((char *)local_120,0x542754);
      std::__cxx11::string::substr((ulong)local_1a0,(ulong)pbVar8);
      CZHelp::trim_copy(in_stack_fffffffffffffc58);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::string(local_248,local_140);
      findTrodesDevice(in_RDX,(string *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffce0)));
      std::__cxx11::string::string(local_268,local_180);
      findTrodesChannel(in_RDX,(NDevice *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffce0)),
                        in_stack_fffffffffffffcd8);
      std::__cxx11::string::~string(local_268);
      NDevice::~NDevice((NDevice *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      std::__cxx11::string::~string(local_248);
      bVar4 = NDeviceChannel::isValid(in_stack_fffffffffffffc48);
      if (bVar4) {
        iVar5 = NDeviceChannel::getType((NDeviceChannel *)(local_248 + 0x68));
        if (iVar5 == 0) {
          in_stack_fffffffffffffc58 = &local_f0;
          in_stack_fffffffffffffc64 =
               NDeviceChannel::getStartByte((NDeviceChannel *)(local_248 + 0x68));
          in_stack_fffffffffffffc54 =
               NDeviceChannel::getStartBit((NDeviceChannel *)(local_248 + 0x68));
          calculateDeviceChannelInfoIndices
                    (in_stack_fffffffffffffc88,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc78,iVar5,
                     in_stack_fffffffffffffc70);
          local_b0 = 0;
        }
        else {
          std::__cxx11::string::string(local_2f0,local_180);
          error(in_RDX,(string *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffce0)));
          poVar9 = std::operator<<((ostream *)&std::cerr,local_2d0);
          std::operator<<(poVar9,
                          " is not an digital channel. Stopping and returning empty parsing info\n")
          ;
          std::__cxx11::string::~string(local_2d0);
          std::__cxx11::string::~string(local_2f0);
          memset(this_00,0,0x40);
          HFParsingInfo::HFParsingInfo
                    ((HFParsingInfo *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
          ;
          local_b0 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a8,"Could not find ",&local_2a9);
        error(in_RDX,(string *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffce0)));
        poVar9 = std::operator<<((ostream *)&std::cerr,local_288);
        in_stack_fffffffffffffc88 = (MlmWrap *)std::operator<<(poVar9,local_140);
        in_stack_fffffffffffffc80 = std::operator<<((ostream *)in_stack_fffffffffffffc88,", ");
        in_stack_fffffffffffffc78 = std::operator<<(in_stack_fffffffffffffc80,local_180);
        std::operator<<(in_stack_fffffffffffffc78,", aborting\n");
        std::__cxx11::string::~string(local_288);
        std::__cxx11::string::~string(local_2a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
        memset(this_00,0,0x40);
        HFParsingInfo::HFParsingInfo
                  ((HFParsingInfo *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_b0 = 1;
      }
      NDeviceChannel::~NDeviceChannel
                ((NDeviceChannel *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_140);
      if (local_b0 != 0) goto LAB_0036cd3b;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(local_110);
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&local_f0);
    local_f0.field_2._8_8_ = sVar6 & 0xfffffffffffffffe;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDX);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX);
    local_b8 = (undefined4)sVar6;
    HFParsingInfo::HFParsingInfo
              ((HFParsingInfo *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (HFParsingInfo *)in_stack_fffffffffffffc48);
    local_b0 = 1;
LAB_0036cd3b:
    HFParsingInfo::~HFParsingInfo
              ((HFParsingInfo *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  }
  else {
    paVar10 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Bad data format from Trodes, aborting\n",paVar10);
    error(in_RDX,(string *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffce0)));
    std::operator<<((ostream *)&std::cerr,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    memset(this_00,0,0x40);
    HFParsingInfo::HFParsingInfo
              ((HFParsingInfo *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    local_b0 = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  return in_RDI;
}

Assistant:

HFParsingInfo MlmWrap::createDigitalParsingInfo(std::vector<std::string> channels, std::string dataformat){
    std::vector<int> startlengths;
    if(!verifyTrodesDataFormat(startlengths, dataformat)){
        std::cerr << error("Bad data format from Trodes, aborting\n");
        return HFParsingInfo();
    }

    HFParsingInfo info;
    //Calculate size of digital packet, first item in info.indices
    info.indices.push_back(0);
    for(size_t i = 0; i < startlengths.size(); i+=2){
        info.indices.back() += startlengths[i+1];
    }

    for(auto &channelstr : channels){
        std::string dv = CZHelp::trim_copy(channelstr.substr(0, channelstr.find(",")));
        std::string ch = CZHelp::trim_copy(channelstr.substr(channelstr.find(",")+1));

        //find channel
        NDeviceChannel channel = findTrodesChannel(findTrodesDevice(dv), ch);
        if(!channel.isValid()){
            std::cerr << error("Could not find ") << dv << ", " << ch << ", aborting\n";
            return HFParsingInfo();
        }

        //Checking for being digital
        if(channel.getType() != 0){
            std::cerr << error(ch) << " is not an digital channel. Stopping and returning empty parsing info\n";
            return HFParsingInfo();
        }

        //Push back digital indices, (startbyte, startbit)
        calculateDeviceChannelInfoIndices(info.indices, startlengths, channel.getStartByte(), channel.getStartBit());
    }
    info.sizeOf = (info.indices.size()/2)*sizeof(int16_t);
    info.dataRequested = channels;
    info.dataLength = channels.size();
    return info;
}